

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::basic_lambda_t(basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *this,basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                       *l)

{
  bool bVar1;
  function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>
  *this_00;
  type __x;
  function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>
  *this_01;
  type __x_00;
  basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *l_local;
  basic_lambda_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *this_local;
  
  std::
  unique_ptr<std::function<std::__cxx11::wstring(std::__cxx11::wstring_const&)>,std::default_delete<std::function<std::__cxx11::wstring(std::__cxx11::wstring_const&)>>>
  ::
  unique_ptr<std::default_delete<std::function<std::__cxx11::wstring(std::__cxx11::wstring_const&)>>,void>
            ((unique_ptr<std::function<std::__cxx11::wstring(std::__cxx11::wstring_const&)>,std::default_delete<std::function<std::__cxx11::wstring(std::__cxx11::wstring_const&)>>>
              *)this);
  std::
  unique_ptr<std::function<std::__cxx11::wstring(std::__cxx11::wstring_const&,kainjow::mustache::basic_renderer<std::__cxx11::wstring>const&)>,std::default_delete<std::function<std::__cxx11::wstring(std::__cxx11::wstring_const&,kainjow::mustache::basic_renderer<std::__cxx11::wstring>const&)>>>
  ::
  unique_ptr<std::default_delete<std::function<std::__cxx11::wstring(std::__cxx11::wstring_const&,kainjow::mustache::basic_renderer<std::__cxx11::wstring>const&)>>,void>
            ((unique_ptr<std::function<std::__cxx11::wstring(std::__cxx11::wstring_const&,kainjow::mustache::basic_renderer<std::__cxx11::wstring>const&)>,std::default_delete<std::function<std::__cxx11::wstring(std::__cxx11::wstring_const&,kainjow::mustache::basic_renderer<std::__cxx11::wstring>const&)>>>
              *)&this->type2_);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)l);
  if (bVar1) {
    this_00 = (function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>
               *)operator_new(0x20);
    __x = Catch::clara::std::
          unique_ptr<std::function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>_>_>
          ::operator*(&l->type1_);
    Catch::clara::std::
    function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>
    ::function(this_00,__x);
    Catch::clara::std::
    unique_ptr<std::function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&)>_>_>
    ::reset(&this->type1_,this_00);
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&l->type2_);
    if (bVar1) {
      this_01 = (function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>
                 *)operator_new(0x20);
      __x_00 = Catch::clara::std::
               unique_ptr<std::function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>_>_>
               ::operator*(&l->type2_);
      Catch::clara::std::
      function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>
      ::function(this_01,__x_00);
      Catch::clara::std::
      unique_ptr<std::function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_(const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>_>_>
      ::reset(&this->type2_,this_01);
    }
  }
  return;
}

Assistant:

basic_lambda_t(const basic_lambda_t& l) {
        if (l.type1_) {
            type1_.reset(new type1(*l.type1_));
        } else if (l.type2_) {
            type2_.reset(new type2(*l.type2_));
        }
    }